

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_set_cell(PWorker worker,TCoord ex,TCoord ey)

{
  long lVar1;
  bool local_21;
  TCoord ey_local;
  TCoord ex_local;
  PWorker worker_local;
  
  lVar1 = ey - worker->min_ey;
  ey_local = ex;
  if (worker->max_ex < ex) {
    ey_local = worker->max_ex;
  }
  ey_local = ey_local - worker->min_ex;
  if (ey_local < 0) {
    ey_local = -1;
  }
  if ((ey_local != worker->ex) || (lVar1 != worker->ey)) {
    if (worker->invalid == 0) {
      gray_record_cell(worker);
    }
    worker->area = 0;
    worker->cover = 0;
    worker->ex = ey_local;
    worker->ey = lVar1;
  }
  local_21 = true;
  if ((uint)lVar1 < (uint)worker->count_ey) {
    local_21 = worker->count_ex <= ey_local;
  }
  worker->invalid = (uint)local_21;
  return;
}

Assistant:

static void
  gray_set_cell( RAS_ARG_ TCoord  ex,
                          TCoord  ey )
  {
    /* Move the cell pointer to a new position.  We set the `invalid'      */
    /* flag to indicate that the cell isn't part of those we're interested */
    /* in during the render phase.  This means that:                       */
    /*                                                                     */
    /* . the new vertical position must be within min_ey..max_ey-1.        */
    /* . the new horizontal position must be strictly less than max_ex     */
    /*                                                                     */
    /* Note that if a cell is to the left of the clipping region, it is    */
    /* actually set to the (min_ex-1) horizontal position.                 */

    /* All cells that are on the left of the clipping region go to the */
    /* min_ex - 1 horizontal position.                                 */
    ey -= ras.min_ey;

    if ( ex > ras.max_ex )
      ex = ras.max_ex;

    ex -= ras.min_ex;
    if ( ex < 0 )
      ex = -1;

    /* are we moving to a different cell ? */
    if ( ex != ras.ex || ey != ras.ey )
    {
      /* record the current one if it is valid */
      if ( !ras.invalid )
        gray_record_cell( RAS_VAR );

      ras.area  = 0;
      ras.cover = 0;
      ras.ex    = ex;
      ras.ey    = ey;
    }

    ras.invalid = ( (unsigned int)ey >= (unsigned int)ras.count_ey ||
                                  ex >= ras.count_ex           );
  }